

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall wasm::OptimizeInstructions::visitCallRef(OptimizeInstructions *this,CallRef *curr)

{
  Expression **input;
  FeatureSet features;
  Expression *target;
  Expression table;
  undefined1 auVar1 [16];
  bool bVar2;
  Index index;
  CallIndirect *rep;
  HeapType HVar3;
  Expression *pEVar4;
  HeapType HVar5;
  Type TVar6;
  LocalGet *get;
  Block *pBVar7;
  Drop *left;
  Call *right;
  ArenaVector<wasm::Expression_*> *args;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args_00;
  char *pcVar8;
  Builder *this_00;
  Type in_R8;
  Name target_00;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  initializer_list<wasm::Expression_*> local_a8;
  undefined1 local_98 [56];
  Drop *pDStack_60;
  Expression *local_58;
  Function *local_48;
  Builder local_40;
  Builder builder;
  size_t sVar9;
  
  input = &curr->target;
  skipNonNullCast(this,input,(Expression *)curr);
  bVar2 = trapOnNull(this,(Expression *)curr,input);
  if (bVar2) {
    return;
  }
  pEVar4 = *input;
  if ((pEVar4->type).id == 1) {
    return;
  }
  if (pEVar4->_id == RefFuncId) {
    local_98._48_8_ =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    this_00 = (Builder *)(local_98 + 0x30);
    sVar9 = *(size_t *)(pEVar4 + 1);
    pcVar8 = (char *)pEVar4[1].type.id;
    TVar6.id = (curr->super_SpecificExpression<(wasm::Expression::Id)61>).super_Expression.type.id;
    bVar2 = curr->isReturn;
    args = &curr->operands;
  }
  else {
    pEVar4 = *input;
    if (pEVar4->_id == TableGetId) {
      local_98._48_8_ =
           (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).
           super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .
           super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .currModule;
      table = pEVar4[1];
      target = *(Expression **)(pEVar4 + 2);
      builder.wasm = (Module *)&curr->operands;
      HVar3 = wasm::Type::getHeapType(&pEVar4->type);
      rep = Builder::makeCallIndirect<ArenaVector<wasm::Expression*>>
                      ((Builder *)(local_98 + 0x30),(Name)table,target,
                       (ArenaVector<wasm::Expression_*> *)builder.wasm,HVar3,curr->isReturn);
      goto LAB_009e0612;
    }
    features.features =
         (((this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).
           super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .
           super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
          .currModule)->features).features;
    pEVar4 = getFallthrough(this,*input);
    if (pEVar4->_id != RefFuncId) {
      local_98._0_8_ = 0;
      local_98._8_8_ = 0;
      local_98._24_8_ =
           std::
           _Function_handler<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp:1423:11)>
           ::_M_invoke;
      local_98._16_8_ =
           std::
           _Function_handler<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp:1423:11)>
           ::_M_manager;
      rep = (CallIndirect *)
            CallUtils::convertToDirectCalls<wasm::CallRef>
                      ((CallUtils *)curr,(CallRef *)local_98,
                       (function<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*)>
                        *)(this->
                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                          ).
                          super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          .
                          super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          .currFunction,
                       (Function *)
                       (this->
                       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                       ).
                       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                       .
                       super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                       .currModule,(Module *)in_R8.id);
      if ((Expression **)local_98._16_8_ != (Expression **)0x0) {
        (*(code *)local_98._16_8_)(local_98,local_98,3);
      }
      if (rep == (CallIndirect *)0x0) {
        return;
      }
      goto LAB_009e0612;
    }
    HVar3 = wasm::Type::getHeapType(&(*input)->type);
    HVar5 = wasm::Type::getHeapType(&pEVar4->type);
    if (HVar3.id != HVar5.id) {
      return;
    }
    local_40.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    sVar9 = (curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (sVar9 == 0) {
      left = Builder::makeDrop(&local_40,curr->target);
      args_00 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)(local_98 + 0x30)
      ;
      local_98._48_8_ = (Expression *)0x0;
      pDStack_60 = (Drop *)0x0;
      local_58 = (Expression *)0x0;
      right = Builder::makeCall(&local_40,(Name)pEVar4[1],args_00,
                                (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)61>).
                                      super_Expression.type.id,curr->isReturn);
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)args_00;
      pBVar7 = Builder::makeSequence(&local_40,(Expression *)left,(Expression *)right,type_00);
      replaceCurrent(this,(Expression *)pBVar7);
      if ((Expression *)local_98._48_8_ == (Expression *)0x0) {
        return;
      }
      operator_delete((void *)local_98._48_8_,(long)local_58 - local_98._48_8_);
      return;
    }
    local_98._32_8_ = &curr->operands;
    builder.wasm = (Module *)
                   (((ExpressionList *)local_98._32_8_)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
                   [sVar9 - 1];
    TVar6.id = ((Type *)&((builder.wasm)->exports).
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->id;
    if (TVar6.id == 1) {
      return;
    }
    bVar2 = TypeUpdating::canHandleAsLocal(TVar6);
    if (!bVar2) {
      return;
    }
    local_48 = (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currFunction;
    local_98._40_8_ = TVar6.id;
    TVar6 = TypeUpdating::getValidLocalType(TVar6,features);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = TVar6.id;
    index = Builder::addVar((Builder *)local_48,(Function *)0x0,(Name)(auVar1 << 0x40),in_R8);
    builder.wasm = (Module *)Builder::makeLocalSet(&local_40,index,builder.wasm);
    local_48 = (Function *)Builder::makeDrop(&local_40,curr->target);
    get = (LocalGet *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id = LocalGetId;
    get->index = index;
    (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
         local_98._40_8_;
    local_58 = TypeUpdating::fixLocalGet
                         (get,(this->
                              super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                              ).
                              super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              .
                              super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              .currModule);
    local_a8._M_array = (iterator)(local_98 + 0x30);
    local_98._48_8_ = builder.wasm;
    pDStack_60 = (Drop *)local_48;
    local_a8._M_len = 3;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)local_48;
    pBVar7 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       (&local_40,&local_a8,type);
    sVar9 = (curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (sVar9 == 0) {
      __assert_fail("usedElements > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                    ,0xd0,
                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                   );
    }
    (curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
    [sVar9 - 1] = (Expression *)pBVar7;
    sVar9 = *(size_t *)(pEVar4 + 1);
    pcVar8 = (char *)pEVar4[1].type.id;
    TVar6.id = (curr->super_SpecificExpression<(wasm::Expression::Id)61>).super_Expression.type.id;
    bVar2 = curr->isReturn;
    this_00 = &local_40;
    args = (ArenaVector<wasm::Expression_*> *)local_98._32_8_;
  }
  target_00.super_IString.str._M_str = pcVar8;
  target_00.super_IString.str._M_len = sVar9;
  rep = (CallIndirect *)
        Builder::makeCall<ArenaVector<wasm::Expression*>>(this_00,target_00,args,TVar6,bVar2);
LAB_009e0612:
  replaceCurrent(this,(Expression *)rep);
  return;
}

Assistant:

void visitCallRef(CallRef* curr) {
    skipNonNullCast(curr->target, curr);
    if (trapOnNull(curr, curr->target)) {
      return;
    }
    if (curr->target->type == Type::unreachable) {
      // The call_ref is not reached; leave this for DCE.
      return;
    }

    if (auto* ref = curr->target->dynCast<RefFunc>()) {
      // We know the target!
      replaceCurrent(
        Builder(*getModule())
          .makeCall(ref->func, curr->operands, curr->type, curr->isReturn));
      return;
    }

    if (auto* get = curr->target->dynCast<TableGet>()) {
      // (call_ref ..args.. (table.get $table (index))
      //   =>
      // (call_indirect $table ..args.. (index))
      replaceCurrent(Builder(*getModule())
                       .makeCallIndirect(get->table,
                                         get->index,
                                         curr->operands,
                                         get->type.getHeapType(),
                                         curr->isReturn));
      return;
    }

    auto features = getModule()->features;

    // It is possible the target is not a function reference, but we can infer
    // the fallthrough value there. It takes more work to optimize this case,
    // but it is pretty important to allow a call_ref to become a fast direct
    // call, so make the effort.
    if (auto* ref = getFallthrough(curr->target)->dynCast<RefFunc>()) {
      // Check if the fallthrough make sense. We may have cast it to a different
      // type, which would be a problem - we'd be replacing a call_ref to one
      // type with a direct call to a function of another type. That would trap
      // at runtime; be careful not to emit invalid IR here.
      if (curr->target->type.getHeapType() != ref->type.getHeapType()) {
        return;
      }
      Builder builder(*getModule());
      if (curr->operands.empty()) {
        // No operands, so this is simple and there is nothing to reorder: just
        // emit:
        //
        // (block
        //  (drop curr->target)
        //  (call ref.func-from-curr->target)
        // )
        replaceCurrent(builder.makeSequence(
          builder.makeDrop(curr->target),
          builder.makeCall(ref->func, {}, curr->type, curr->isReturn)));
        return;
      }

      // In the presence of operands, we must execute the code in curr->target
      // after the last operand and before the call happens. Interpose at the
      // last operand:
      //
      // (call ref.func-from-curr->target)
      //  (operand1)
      //  (..)
      //  (operandN-1)
      //  (block
      //   (local.set $temp (operandN))
      //   (drop curr->target)
      //   (local.get $temp)
      //  )
      // )
      auto* lastOperand = curr->operands.back();
      auto lastOperandType = lastOperand->type;
      if (lastOperandType == Type::unreachable) {
        // The call_ref is not reached; leave this for DCE.
        return;
      }
      if (!TypeUpdating::canHandleAsLocal(lastOperandType)) {
        // We cannot create a local, so we must give up.
        return;
      }
      Index tempLocal = builder.addVar(
        getFunction(),
        TypeUpdating::getValidLocalType(lastOperandType, features));
      auto* set = builder.makeLocalSet(tempLocal, lastOperand);
      auto* drop = builder.makeDrop(curr->target);
      auto* get = TypeUpdating::fixLocalGet(
        builder.makeLocalGet(tempLocal, lastOperandType), *getModule());
      curr->operands.back() = builder.makeBlock({set, drop, get});
      replaceCurrent(builder.makeCall(
        ref->func, curr->operands, curr->type, curr->isReturn));
      return;
    }

    // If the target is a select of two different constants, we can emit an if
    // over two direct calls.
    if (auto* calls = CallUtils::convertToDirectCalls(
          curr,
          [](Expression* target) -> CallUtils::IndirectCallInfo {
            if (auto* refFunc = target->dynCast<RefFunc>()) {
              return CallUtils::Known{refFunc->func};
            }
            return CallUtils::Unknown{};
          },
          *getFunction(),
          *getModule())) {
      replaceCurrent(calls);
    }
  }